

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

void __thiscall
rsg::ComputeMulRange::operator()
          (ComputeMulRange *this,Random *rnd,float dstMin,float dstMax,float *aMin,float *aMax,
          float *bMin,float *bMax)

{
  deUint32 dVar1;
  deBool dVar2;
  int i;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 local_4c;
  
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  local_4c = (float)(dVar1 & 7) * 0.25 + 0.25;
  fVar4 = ceilf((dstMin / local_4c) * 8.0);
  fVar4 = fVar4 * 0.125;
  if (fVar4 <= dstMax / local_4c) {
    fVar5 = floorf((dstMax / local_4c) * 8.0);
    fVar6 = fVar5 * 0.125;
    if (fVar4 <= fVar5 * 0.125) goto LAB_00a6d31a;
  }
  local_4c = 1.0;
  fVar6 = dstMax;
  fVar4 = dstMin;
LAB_00a6d31a:
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  iVar3 = 0;
  fVar5 = (float)(int)(dVar1 % ((int)((fVar6 - fVar4) * 4.0) + 1U)) * 0.25 + 0.0;
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  fVar4 = (float)(int)(dVar1 % ((int)(((fVar6 - fVar4) - fVar5) * 4.0) + 1U)) * 0.25 + 0.0 + fVar4;
  *aMin = fVar4;
  *aMax = fVar4 + fVar5;
  *bMin = local_4c;
  *bMax = local_4c;
  do {
    fVar4 = *aMin;
    fVar6 = (float)iVar3 * -0.25 + local_4c;
    if ((((dstMin <= fVar6 * fVar4) && (fVar6 * fVar4 < dstMax)) && (dstMin <= *aMax * fVar6)) &&
       (*aMax * fVar6 < dstMax)) {
      *bMin = fVar6;
      fVar4 = *aMin;
    }
    fVar6 = (float)iVar3 * 0.25 + local_4c;
    if (((dstMin <= fVar4 * fVar6) && (fVar4 * fVar6 < dstMax)) &&
       ((dstMin <= *aMax * fVar6 && (*aMax * fVar6 < dstMax)))) {
      *bMax = fVar6;
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 5);
  dVar2 = deRandom_getBool(&rnd->m_rnd);
  if (dVar2 == 1) {
    fVar4 = *aMin;
    *aMin = *aMax;
    *aMax = fVar4;
    fVar4 = *bMin;
    *bMin = *bMax;
    *bMax = fVar4;
    *aMin = -*aMin;
    *aMax = -*aMax;
    *bMin = -*bMin;
    *bMax = -*bMax;
  }
  return;
}

Assistant:

void ComputeMulRange::operator() (de::Random& rnd, float dstMin, float dstMax, float& aMin, float& aMax, float& bMin, float& bMax) const
{
	const float minScale	 = 0.25f;
	const float maxScale	 = 2.0f;
	const float subRangeStep = 0.25f;
	const float scaleStep	 = 0.25f;

	float scale		= getQuantizedFloat(rnd, minScale, maxScale, scaleStep);
	float scaledMin	= dstMin/scale;
	float scaledMax	= dstMax/scale;

	// Quantize scaled value range if possible
	if (!quantizeFloatRange(scaledMin, scaledMax))
	{
		// Fall back to 1.0 as a scale
		scale		= 1.0f;
		scaledMin	= dstMin;
		scaledMax	= dstMax;
	}

	float subRangeLen = getQuantizedFloat(rnd, 0.0f, scaledMax-scaledMin, subRangeStep);
	aMin = scaledMin + getQuantizedFloat(rnd, 0.0f, (scaledMax-scaledMin)-subRangeLen, subRangeStep);
	aMax = aMin + subRangeLen;

	// Find scale range
	bMin = scale;
	bMax = scale;
	for (int i = 0; i < 5; i++)
	{
		if (de::inBounds(aMin*(scale-(float)i*scaleStep), dstMin, dstMax) &&
			de::inBounds(aMax*(scale-(float)i*scaleStep), dstMin, dstMax))
			bMin = scale-(float)i*scaleStep;

		if (de::inBounds(aMin*(scale+(float)i*scaleStep), dstMin, dstMax) &&
			de::inBounds(aMax*(scale+(float)i*scaleStep), dstMin, dstMax))
			bMax = scale+(float)i*scaleStep;
	}

	// Negative scale?
	if (rnd.getBool())
	{
		std::swap(aMin, aMax);
		std::swap(bMin, bMax);
		aMin	*= -1.0f;
		aMax	*= -1.0f;
		bMin	*= -1.0f;
		bMax	*= -1.0f;
	}

#if defined(DE_DEBUG)
	const float eps = 0.001f;
	DE_ASSERT(aMin <= aMax && bMin <= bMax);
	DE_ASSERT(de::inRange(aMin*bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMin*bMax, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax*bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax*bMax, dstMin-eps, dstMax+eps));
#endif
}